

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>
          (BuildKey *this,char kindCode,StringRef name,StringList *data)

{
  uint uVar1;
  uint uVar2;
  ulong __n;
  void *__dest;
  string encodedKey;
  BinaryEncoder encoder;
  ulong *local_198;
  ulong uStack_190;
  ulong local_188 [3];
  char *local_170;
  long *local_168;
  undefined8 uStack_160;
  long local_158 [3];
  BinaryEncoder local_140;
  
  local_170 = name.Data;
  (this->key).key._M_dataplus._M_p = (pointer)&(this->key).key.field_2;
  (this->key).key._M_string_length = 0;
  (this->key).key.field_2._M_local_buf[0] = '\0';
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
       &local_140.encdata.super_SmallVectorStorage<unsigned_char,_256U>;
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = 0;
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity = 0x100;
  basic::StringList::encode(data,&local_140);
  local_198 = (ulong *)0x0;
  uStack_190 = 0;
  local_188[0] = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_initialize<unsigned_char*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_198,
             local_140.encdata.super_SmallVectorImpl<unsigned_char>.
             super_SmallVectorTemplateBase<unsigned_char,_true>.
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX,
             (AlignedCharArrayUnion<unsigned_char,_char,_char,_char,_char,_char,_char,_char,_char,_char>
              *)local_140.encdata.super_SmallVectorImpl<unsigned_char>.
                super_SmallVectorTemplateBase<unsigned_char,_true>.
                super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX +
             (local_140.encdata.super_SmallVectorImpl<unsigned_char>.
              super_SmallVectorTemplateBase<unsigned_char,_true>.
              super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff));
  uVar1 = (int)uStack_190 - (int)local_198;
  if (local_198 != (ulong *)0x0) {
    operator_delete(local_198,local_188[0] - (long)local_198);
  }
  local_198 = local_188;
  uStack_190 = 0;
  local_188[0] = local_188[0] & 0xffffffffffffff00;
  __n = name.Length & 0xffffffff;
  std::__cxx11::string::resize((ulong)&local_198,(char)uVar1 + (char)__n + '\x05');
  *(char *)local_198 = kindCode;
  *(int *)((long)local_198 + 1) = (int)name.Length;
  memcpy((void *)((long)local_198 + 5),local_170,__n);
  uVar2 = (int)name.Length + 5;
  __dest = (void *)((long)local_198 + (ulong)uVar2);
  local_168 = (long *)0x0;
  uStack_160 = 0;
  local_158[0] = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_initialize<unsigned_char*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_168,
             local_140.encdata.super_SmallVectorImpl<unsigned_char>.
             super_SmallVectorTemplateBase<unsigned_char,_true>.
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX,
             (AlignedCharArrayUnion<unsigned_char,_char,_char,_char,_char,_char,_char,_char,_char,_char>
              *)local_140.encdata.super_SmallVectorImpl<unsigned_char>.
                super_SmallVectorTemplateBase<unsigned_char,_true>.
                super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX +
             (local_140.encdata.super_SmallVectorImpl<unsigned_char>.
              super_SmallVectorTemplateBase<unsigned_char,_true>.
              super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff));
  memcpy(__dest,local_168,(ulong)uVar1);
  if (local_168 != (long *)0x0) {
    operator_delete(local_168,local_158[0] - (long)local_168);
  }
  if (uStack_190 == uVar2 + uVar1) {
    local_168 = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,local_198,(long)local_198 + uStack_190);
    std::__cxx11::string::operator=((string *)this,(string *)&local_168);
    if (local_168 != local_158) {
      operator_delete(local_168,local_158[0] + 1);
    }
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if ((SmallVectorStorage<unsigned_char,_256U> *)
        local_140.encdata.super_SmallVectorImpl<unsigned_char>.
        super_SmallVectorTemplateBase<unsigned_char,_true>.
        super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX !=
        &local_140.encdata.super_SmallVectorStorage<unsigned_char,_256U>) {
      free(local_140.encdata.super_SmallVectorImpl<unsigned_char>.
           super_SmallVectorTemplateBase<unsigned_char,_true>.
           super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX);
    }
    return;
  }
  __assert_fail("encodedKey.size() == pos",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                ,0x67,
                "llbuild::buildsystem::BuildKey::BuildKey(char, StringRef, const BinaryEncodable &) [BinaryEncodable = llbuild::basic::StringList]"
               );
}

Assistant:

BuildKey(char kindCode, StringRef name, const BinaryEncodable& data) {
    uint32_t nameSize = name.size();

    // FIXME: Perhaps should use this encoder for the key itself? Right now
    // we're manually building the keys and causing some extra memcpy overhead
    // here.
    basic::BinaryEncoder encoder;
    encoder.write(data);
    uint32_t dataSize = encoder.contents().size();

    std::string encodedKey;
    encodedKey.resize(1 + sizeof(uint32_t) + nameSize + dataSize);
    uint32_t pos = 0;
    encodedKey[pos] = kindCode; pos += 1;
    memcpy(&encodedKey[pos], &nameSize, sizeof(uint32_t));
    pos += sizeof(uint32_t);
    memcpy(&encodedKey[pos], name.data(), nameSize);
    pos += nameSize;
    memcpy(&encodedKey[pos], encoder.contents().data(), dataSize);
    pos += dataSize;
    assert(encodedKey.size() == pos);
    (void)pos;
    key = encodedKey;
  }